

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

JavascriptString * __thiscall
Js::JavascriptString::ConcatDestructive_CompoundAppendChars
          (JavascriptString *this,JavascriptString *pstRight)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 *pcVar4;
  CompoundString *this_00;
  char16_t *pcVar5;
  
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x20e,"(pstRight)","pstRight");
    if (!bVar2) goto LAB_00bbaf70;
    *puVar3 = 0;
  }
  if (((this->m_charLength == 0) || (pstRight->m_charLength == 0)) ||
     ((bVar2 = CompoundString::ShouldAppendChars(this->m_charLength), !bVar2 &&
      (bVar2 = CompoundString::ShouldAppendChars(pstRight->m_charLength), !bVar2)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x212,
                                "(GetLength() != 0 && pstRight->GetLength() != 0 && (CompoundString::ShouldAppendChars(GetLength()) || CompoundString::ShouldAppendChars(pstRight->GetLength())))"
                                ,
                                "GetLength() != 0 && pstRight->GetLength() != 0 && (CompoundString::ShouldAppendChars(GetLength()) || CompoundString::ShouldAppendChars(pstRight->GetLength()))"
                               );
    if (!bVar2) {
LAB_00bbaf70:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  StringProfiler::RecordConcatenation
            ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,this->m_charLength,
             pstRight->m_charLength,ConcatType_CompoundString);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,StringConcatPhase);
  if (bVar2) {
    pcVar5 = L"...";
    if ((pstRight->m_pszValue).ptr == (char16_t *)0x0) {
      pcVar4 = L"";
    }
    else {
      pcVar4 = GetString(pstRight);
      if (((pstRight->m_pszValue).ptr != (char16_t *)0x0) &&
         (pcVar5 = L"", 8 < pstRight->m_charLength)) {
        pcVar5 = L"...";
      }
    }
    Output::Print(L"JavascriptString::ConcatDestructive(\"%.8s%s\") - creating CompoundString, appending chars\n"
                  ,pcVar4,pcVar5);
    Output::Flush();
  }
  this_00 = CompoundString::NewWithPointerCapacity
                      (4,(((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr);
  CompoundString::AppendChars(this_00,this);
  CompoundString::AppendChars(this_00,pstRight);
  return (JavascriptString *)this_00;
}

Assistant:

JavascriptString* JavascriptString::ConcatDestructive_CompoundAppendChars(JavascriptString* pstRight)
    {
        Assert(pstRight);
        Assert(
            GetLength() != 0 &&
            pstRight->GetLength() != 0 &&
            (CompoundString::ShouldAppendChars(GetLength()) || CompoundString::ShouldAppendChars(pstRight->GetLength())));

#ifdef PROFILE_STRINGS
        StringProfiler::RecordConcatenation(GetScriptContext(), GetLength(), pstRight->GetLength(), ConcatType_CompoundString);
#endif
        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("JavascriptString::ConcatDestructive(\"%.8s%s\") - creating CompoundString, appending chars\n"),
                pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
            Output::Flush();
        }

        CompoundString *const cs = CompoundString::NewWithPointerCapacity(4, GetLibrary());
        cs->AppendChars(this);
        cs->AppendChars(pstRight);
        return cs;
    }